

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleReadSymlinkCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  undefined8 name;
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  char *value;
  string local_390;
  undefined1 local_370 [8];
  ostringstream e_1;
  undefined1 local_1f8 [8];
  string result;
  string *outputVariable;
  string *filename;
  ostringstream local_198 [8];
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar1 == 3) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,1);
    result.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](args,2);
    std::__cxx11::string::string((string *)local_1f8);
    this_local._7_1_ = cmsys::SystemTools::ReadSymlink(pvVar2,(string *)local_1f8);
    name = result.field_2._8_8_;
    if (this_local._7_1_) {
      this_00 = (this->super_cmCommand).Makefile;
      value = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,(string *)name,value);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
      poVar3 = std::operator<<((ostream *)local_370,
                               "READ_SYMLINK requested of path that is not a symlink:\n  ");
      std::operator<<(poVar3,(string *)pvVar2);
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
    }
    std::__cxx11::string::~string((string *)local_1f8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    poVar3 = std::operator<<((ostream *)local_198,(string *)pvVar2);
    std::operator<<(poVar3," requires a file name and output variable");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&filename);
    std::__cxx11::string::~string((string *)&filename);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileCommand::HandleReadSymlinkCommand(
  std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    std::ostringstream e;
    e << args[0] << " requires a file name and output variable";
    this->SetError(e.str());
    return false;
  }

  const std::string& filename = args[1];
  const std::string& outputVariable = args[2];

  std::string result;
  if (!cmSystemTools::ReadSymlink(filename, result)) {
    std::ostringstream e;
    e << "READ_SYMLINK requested of path that is not a symlink:\n  "
      << filename;
    this->SetError(e.str());
    return false;
  }

  this->Makefile->AddDefinition(outputVariable, result.c_str());

  return true;
}